

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::SubpassDescription::SubpassDescription
          (SubpassDescription *this,VkPipelineBindPoint _pipelineBindPoint,
          VkSubpassDescriptionFlags _flags,deUint32 _inputAttachmentCount,
          VkAttachmentReference *_inputAttachments,deUint32 _colorAttachmentCount,
          VkAttachmentReference *_colorAttachments,VkAttachmentReference *_resolveAttachments,
          VkAttachmentReference depthStencilAttachment,deUint32 _preserveAttachmentCount,
          deUint32 *_preserveAttachments)

{
  pointer pVVar1;
  pointer puVar2;
  allocator_type local_71;
  VkSubpassDescriptionFlags local_70;
  VkPipelineBindPoint local_6c;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *local_58;
  _Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> local_50;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *local_38;
  
  local_58 = &this->m_colorAttachments;
  local_68 = &this->m_resolveAttachments;
  local_60 = &this->m_preserveAttachments;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_preserveAttachments).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_resolveAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_colorAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputAttachments).
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = _flags;
  local_6c = _pipelineBindPoint;
  local_38 = &this->m_inputAttachments;
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_50,_inputAttachments,_inputAttachments + _inputAttachmentCount,&local_71);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::_M_move_assign
            (&this->m_inputAttachments,&local_50);
  std::_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
  ~_Vector_base(&local_50);
  std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
  vector<vk::VkAttachmentReference_const*,void>
            ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
             &local_50,_colorAttachments,_colorAttachments + _colorAttachmentCount,&local_71);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::_M_move_assign
            (local_58,&local_50);
  std::_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
  ~_Vector_base(&local_50);
  if (_resolveAttachments != (VkAttachmentReference *)0x0) {
    std::vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>>::
    vector<vk::VkAttachmentReference_const*,void>
              ((vector<vk::VkAttachmentReference,std::allocator<vk::VkAttachmentReference>> *)
               &local_50,_resolveAttachments,_resolveAttachments + _colorAttachmentCount,&local_71);
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
    _M_move_assign(local_68,&local_50);
    std::_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
    ~_Vector_base(&local_50);
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_50,_preserveAttachments,
             _preserveAttachments + _preserveAttachmentCount,(allocator_type *)&local_71);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(local_60,&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  this->m_depthStencilAttachment = depthStencilAttachment;
  (this->super_VkSubpassDescription).flags = local_70;
  (this->super_VkSubpassDescription).pipelineBindPoint = local_6c;
  (this->super_VkSubpassDescription).inputAttachmentCount = _inputAttachmentCount;
  (this->super_VkSubpassDescription).pInputAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).colorAttachmentCount = _colorAttachmentCount;
  (this->super_VkSubpassDescription).pColorAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).pResolveAttachments = (VkAttachmentReference *)0x0;
  (this->super_VkSubpassDescription).pDepthStencilAttachment = &this->m_depthStencilAttachment;
  (this->super_VkSubpassDescription).pPreserveAttachments = (deUint32 *)0x0;
  (this->super_VkSubpassDescription).preserveAttachmentCount = _preserveAttachmentCount;
  pVVar1 = (this->m_inputAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_inputAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pInputAttachments = pVVar1;
  }
  pVVar1 = (this->m_colorAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_colorAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pColorAttachments = pVVar1;
  }
  pVVar1 = (this->m_resolveAttachments).
           super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_resolveAttachments).
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pResolveAttachments = pVVar1;
  }
  puVar2 = (this->m_preserveAttachments).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (this->m_preserveAttachments).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (this->super_VkSubpassDescription).pPreserveAttachments = puVar2;
  }
  return;
}

Assistant:

SubpassDescription::SubpassDescription (vk::VkPipelineBindPoint				_pipelineBindPoint,
										vk::VkSubpassDescriptionFlags		_flags,
										deUint32							_inputAttachmentCount,
										const vk::VkAttachmentReference*	_inputAttachments,
										deUint32							_colorAttachmentCount,
										const vk::VkAttachmentReference*	_colorAttachments,
										const vk::VkAttachmentReference*	_resolveAttachments,
										vk::VkAttachmentReference			depthStencilAttachment,
										deUint32							_preserveAttachmentCount,
										const deUint32*						_preserveAttachments)
{
	m_inputAttachments = std::vector<vk::VkAttachmentReference>(_inputAttachments, _inputAttachments + _inputAttachmentCount);
	m_colorAttachments = std::vector<vk::VkAttachmentReference>(_colorAttachments, _colorAttachments + _colorAttachmentCount);

	if (_resolveAttachments)
		m_resolveAttachments = std::vector<vk::VkAttachmentReference>(_resolveAttachments, _resolveAttachments + _colorAttachmentCount);

	m_preserveAttachments = std::vector<deUint32>(_preserveAttachments, _preserveAttachments + _preserveAttachmentCount);

	m_depthStencilAttachment = depthStencilAttachment;

	flags					= _flags;
	pipelineBindPoint		= _pipelineBindPoint;
	inputAttachmentCount	= _inputAttachmentCount;
	pInputAttachments		= DE_NULL;
	colorAttachmentCount	= _colorAttachmentCount;
	pColorAttachments		= DE_NULL;
	pResolveAttachments		= DE_NULL;
	pDepthStencilAttachment	= &m_depthStencilAttachment;
	pPreserveAttachments	= DE_NULL;
	preserveAttachmentCount	= _preserveAttachmentCount;

	if (!m_inputAttachments.empty())
		pInputAttachments = &m_inputAttachments[0];

	if (!m_colorAttachments.empty())
		pColorAttachments = &m_colorAttachments[0];

	if (!m_resolveAttachments.empty())
		pResolveAttachments = &m_resolveAttachments[0];

	if (!m_preserveAttachments.empty())
		pPreserveAttachments = &m_preserveAttachments[0];
}